

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableEndRow(ImGuiTable *table)

{
  ImSpan<ImGuiTableColumn> *this;
  float fVar1;
  char cVar2;
  char cVar3;
  ImGuiWindow *window;
  ImDrawList *pIVar4;
  float fVar5;
  ImRect IVar6;
  ImRect IVar7;
  ImGuiTableCellData *pIVar8;
  ImGuiTableCellData *pIVar9;
  ImGuiTableColumn *pIVar10;
  ImU32 col;
  int column_n;
  int iVar11;
  int iVar12;
  ImU32 col_00;
  int iVar13;
  ImU32 col_01;
  uint uVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  ImRect row_rect;
  ImVec2 local_38;
  
  window = GImGui->CurrentWindow;
  if (window != table->InnerWindow) {
    __assert_fail("window == table->InnerWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x645,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->IsInsideRow == false) {
    __assert_fail("table->IsInsideRow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                  ,0x646,"void ImGui::TableEndRow(ImGuiTable *)");
  }
  if (table->CurrentColumn != -1) {
    TableEndCell(table);
  }
  fVar1 = table->RowPosY2;
  (window->DC).CursorPos.y = fVar1;
  fVar17 = table->RowPosY1;
  iVar11 = table->CurrentRow;
  if (iVar11 == 0) {
    table->LastFirstRowHeight = fVar1 - fVar17;
  }
  iVar13 = iVar11 + 1;
  iVar12 = (int)table->FreezeRowsCount;
  cVar2 = table->FreezeRowsRequest;
  if (((table->InnerClipRect).Min.y <= fVar1) && (fVar17 <= (table->InnerClipRect).Max.y)) {
    col_00 = table->RowBgColor[0];
    if ((col_00 == 0x1000000) && (col_00 = 0, (table->Flags & 0x40) != 0)) {
      col_00 = GetColorU32((table->RowBgColorCounter & 1U) + 0x2d,1.0);
      iVar11 = table->CurrentRow;
    }
    col_01 = table->RowBgColor[1];
    col = 0;
    if (col_01 == 0x1000000) {
      col_01 = 0;
    }
    if (((0 < iVar11) || (table->InnerWindow == table->OuterWindow)) &&
       (col = 0, (table->Flags & 0x80) != 0)) {
      col = table->RowBgColor[(ulong)((table->field_0x92 & 1) == 0) + 2];
    }
    cVar3 = table->RowCellDataCurrent;
    if ((-1 < cVar3 || iVar13 == iVar12) || (col != 0 || (col_01 != 0 || col_00 != 0))) {
      if ((table->Flags & 0x80000) == 0) {
        fVar15 = (table->Bg0ClipRectForDrawCmd).Min.y;
        fVar16 = (table->Bg0ClipRectForDrawCmd).Max.x;
        fVar5 = (table->Bg0ClipRectForDrawCmd).Max.y;
        pIVar4 = window->DrawList;
        (pIVar4->_CmdHeader).ClipRect.x = (table->Bg0ClipRectForDrawCmd).Min.x;
        (pIVar4->_CmdHeader).ClipRect.y = fVar15;
        (pIVar4->_CmdHeader).ClipRect.z = fVar16;
        (pIVar4->_CmdHeader).ClipRect.w = fVar5;
      }
      ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,window->DrawList,0);
    }
    if (col_01 != 0 || col_00 != 0) {
      row_rect.Min.y = fVar17;
      row_rect.Min.x = (table->WorkRect).Min.x;
      row_rect.Max.x = (table->WorkRect).Max.x;
      row_rect.Max.y = fVar1;
      ImRect::ClipWith(&row_rect,&table->BgClipRect);
      if ((col_00 != 0) && (row_rect.Min.y < row_rect.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&row_rect.Min,&row_rect.Max,col_00,0.0,0xf);
      }
      if ((col_01 != 0) && (row_rect.Min.y < row_rect.Max.y)) {
        ImDrawList::AddRectFilled(window->DrawList,&row_rect.Min,&row_rect.Max,col_01,0.0,0xf);
      }
    }
    if (-1 < cVar3) {
      pIVar8 = ImSpan<ImGuiTableCellData>::operator[]
                         (&table->RowCellData,(int)table->RowCellDataCurrent);
      pIVar9 = ImSpan<ImGuiTableCellData>::operator[](&table->RowCellData,0);
      for (; pIVar9 <= pIVar8; pIVar9 = pIVar9 + 1) {
        pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)pIVar9->Column);
        row_rect = TableGetCellBgRect(table,(int)pIVar9->Column);
        ImRect::ClipWith(&row_rect,&table->BgClipRect);
        IVar6 = row_rect;
        fVar15 = (pIVar10->ClipRect).Min.x;
        fVar16 = row_rect.Max.x;
        uVar14 = -(uint)(fVar15 <= row_rect.Min.x);
        row_rect.Min.x = (float)(uVar14 & (uint)row_rect.Min.x | ~uVar14 & (uint)fVar15);
        IVar7 = row_rect;
        if (pIVar10->MaxX <= fVar16) {
          fVar16 = pIVar10->MaxX;
        }
        row_rect.Max.y = IVar6.Max.y;
        row_rect.Min = IVar7.Min;
        row_rect.Max.x = fVar16;
        ImDrawList::AddRectFilled
                  (window->DrawList,&row_rect.Min,&row_rect.Max,pIVar9->BgColor,0.0,0xf);
      }
    }
    if (((col != 0) && ((table->BgClipRect).Min.y <= fVar17)) &&
       (fVar17 < (table->BgClipRect).Max.y)) {
      row_rect.Min.y = fVar17;
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar17;
      ImDrawList::AddLine(window->DrawList,&row_rect.Min,&local_38,col,1.0);
    }
    if (((iVar13 == iVar12) && ((table->BgClipRect).Min.y <= fVar1)) &&
       (fVar1 < (table->BgClipRect).Max.y)) {
      row_rect.Min.y = fVar1;
      row_rect.Min.x = table->BorderX1;
      local_38.x = table->BorderX2;
      local_38.y = fVar1;
      ImDrawList::AddLine(window->DrawList,&row_rect.Min,&local_38,table->BorderColorStrong,1.0);
    }
  }
  if (iVar13 == cVar2) {
    for (iVar11 = 0; iVar11 < table->ColumnsCount; iVar11 = iVar11 + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar11);
      pIVar10->NavLayerCurrent = iVar11 < table->FreezeColumnsCount;
    }
  }
  if (iVar13 == iVar12) {
    if (table->IsUnfrozenRows != false) {
      __assert_fail("table->IsUnfrozenRows == false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0x6a5,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    table->IsUnfrozenRows = true;
    fVar1 = table->RowPosY2;
    fVar17 = (window->InnerClipRect).Min.y;
    fVar15 = (window->InnerClipRect).Max.y;
    uVar14 = -(uint)(fVar17 <= fVar1 + 1.0);
    fVar17 = (float)(~uVar14 & (uint)fVar17 | (uint)(fVar1 + 1.0) & uVar14);
    if (fVar15 <= fVar17) {
      fVar17 = fVar15;
    }
    (table->Bg2ClipRectForDrawCmd).Min.y = fVar17;
    (table->BgClipRect).Min.y = fVar17;
    (table->Bg2ClipRectForDrawCmd).Max.y = fVar15;
    (table->BgClipRect).Max.y = fVar15;
    table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
    if (fVar15 < fVar17) {
      __assert_fail("table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_tables.cpp"
                    ,0x6ad,"void ImGui::TableEndRow(ImGuiTable *)");
    }
    fVar17 = table->RowPosY1;
    fVar15 = (fVar1 + (table->WorkRect).Min.y) - (table->OuterRect).Min.y;
    (window->DC).CursorPos.y = fVar15;
    table->RowPosY2 = fVar15;
    table->RowPosY1 = fVar15 - (fVar1 - fVar17);
    this = &table->Columns;
    for (iVar11 = 0; iVar11 < table->ColumnsCount; iVar11 = iVar11 + 1) {
      pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,iVar11);
      pIVar10->DrawChannelCurrent = pIVar10->DrawChannelUnfrozen;
      (pIVar10->ClipRect).Min.y = (table->Bg2ClipRectForDrawCmd).Min.y;
    }
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    SetWindowClipRectBeforeSetChannel(window,&pIVar10->ClipRect);
    pIVar4 = window->DrawList;
    pIVar10 = ImSpan<ImGuiTableColumn>::operator[](this,0);
    ImDrawListSplitter::SetCurrentChannel
              (&table->DrawSplitter,pIVar4,(uint)pIVar10->DrawChannelCurrent);
  }
  if ((table->field_0x90 & 1) == 0) {
    table->RowBgColorCounter = table->RowBgColorCounter + 1;
  }
  table->IsInsideRow = false;
  return;
}

Assistant:

void ImGui::TableEndRow(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window == table->InnerWindow);
    IM_ASSERT(table->IsInsideRow);

    if (table->CurrentColumn != -1)
        TableEndCell(table);

    // Position cursor at the bottom of our row so it can be used for e.g. clipping calculation. However it is
    // likely that the next call to TableBeginCell() will reposition the cursor to take account of vertical padding.
    window->DC.CursorPos.y = table->RowPosY2;

    // Row background fill
    const float bg_y1 = table->RowPosY1;
    const float bg_y2 = table->RowPosY2;
    const bool unfreeze_rows_actual = (table->CurrentRow + 1 == table->FreezeRowsCount);
    const bool unfreeze_rows_request = (table->CurrentRow + 1 == table->FreezeRowsRequest);
    if (table->CurrentRow == 0)
        table->LastFirstRowHeight = bg_y2 - bg_y1;

    const bool is_visible = (bg_y2 >= table->InnerClipRect.Min.y && bg_y1 <= table->InnerClipRect.Max.y);
    if (is_visible)
    {
        // Decide of background color for the row
        ImU32 bg_col0 = 0;
        ImU32 bg_col1 = 0;
        if (table->RowBgColor[0] != IM_COL32_DISABLE)
            bg_col0 = table->RowBgColor[0];
        else if (table->Flags & ImGuiTableFlags_RowBg)
            bg_col0 = GetColorU32((table->RowBgColorCounter & 1) ? ImGuiCol_TableRowBgAlt : ImGuiCol_TableRowBg);
        if (table->RowBgColor[1] != IM_COL32_DISABLE)
            bg_col1 = table->RowBgColor[1];

        // Decide of top border color
        ImU32 border_col = 0;
        const float border_size = TABLE_BORDER_SIZE;
        if (table->CurrentRow > 0 || table->InnerWindow == table->OuterWindow)
            if (table->Flags & ImGuiTableFlags_BordersInnerH)
                border_col = (table->LastRowFlags & ImGuiTableRowFlags_Headers) ? table->BorderColorStrong : table->BorderColorLight;

        const bool draw_cell_bg_color = table->RowCellDataCurrent >= 0;
        const bool draw_strong_bottom_border = unfreeze_rows_actual;
        if ((bg_col0 | bg_col1 | border_col) != 0 || draw_strong_bottom_border || draw_cell_bg_color)
        {
            // In theory we could call SetWindowClipRectBeforeSetChannel() but since we know TableEndRow() is
            // always followed by a change of clipping rectangle we perform the smallest overwrite possible here.
            if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
                window->DrawList->_CmdHeader.ClipRect = table->Bg0ClipRectForDrawCmd.ToVec4();
            table->DrawSplitter.SetCurrentChannel(window->DrawList, TABLE_DRAW_CHANNEL_BG0);
        }

        // Draw row background
        // We soft/cpu clip this so all backgrounds and borders can share the same clipping rectangle
        if (bg_col0 || bg_col1)
        {
            ImRect row_rect(table->WorkRect.Min.x, bg_y1, table->WorkRect.Max.x, bg_y2);
            row_rect.ClipWith(table->BgClipRect);
            if (bg_col0 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col0);
            if (bg_col1 != 0 && row_rect.Min.y < row_rect.Max.y)
                window->DrawList->AddRectFilled(row_rect.Min, row_rect.Max, bg_col1);
        }

        // Draw cell background color
        if (draw_cell_bg_color)
        {
            ImGuiTableCellData* cell_data_end = &table->RowCellData[table->RowCellDataCurrent];
            for (ImGuiTableCellData* cell_data = &table->RowCellData[0]; cell_data <= cell_data_end; cell_data++)
            {
                const ImGuiTableColumn* column = &table->Columns[cell_data->Column];
                ImRect cell_bg_rect = TableGetCellBgRect(table, cell_data->Column);
                cell_bg_rect.ClipWith(table->BgClipRect);
                cell_bg_rect.Min.x = ImMax(cell_bg_rect.Min.x, column->ClipRect.Min.x);     // So that first column after frozen one gets clipped
                cell_bg_rect.Max.x = ImMin(cell_bg_rect.Max.x, column->MaxX);
                window->DrawList->AddRectFilled(cell_bg_rect.Min, cell_bg_rect.Max, cell_data->BgColor);
            }
        }

        // Draw top border
        if (border_col && bg_y1 >= table->BgClipRect.Min.y && bg_y1 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y1), ImVec2(table->BorderX2, bg_y1), border_col, border_size);

        // Draw bottom border at the row unfreezing mark (always strong)
        if (draw_strong_bottom_border && bg_y2 >= table->BgClipRect.Min.y && bg_y2 < table->BgClipRect.Max.y)
            window->DrawList->AddLine(ImVec2(table->BorderX1, bg_y2), ImVec2(table->BorderX2, bg_y2), table->BorderColorStrong, border_size);
    }

    // End frozen rows (when we are past the last frozen row line, teleport cursor and alter clipping rectangle)
    // We need to do that in TableEndRow() instead of TableBeginRow() so the list clipper can mark end of row and
    // get the new cursor position.
    if (unfreeze_rows_request)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->NavLayerCurrent = (ImS8)((column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);
        }
    if (unfreeze_rows_actual)
    {
        IM_ASSERT(table->IsUnfrozenRows == false);
        table->IsUnfrozenRows = true;

        // BgClipRect starts as table->InnerClipRect, reduce it now and make BgClipRectForDrawCmd == BgClipRect
        float y0 = ImMax(table->RowPosY2 + 1, window->InnerClipRect.Min.y);
        table->BgClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y = ImMin(y0, window->InnerClipRect.Max.y);
        table->BgClipRect.Max.y = table->Bg2ClipRectForDrawCmd.Max.y = window->InnerClipRect.Max.y;
        table->Bg2DrawChannelCurrent = table->Bg2DrawChannelUnfrozen;
        IM_ASSERT(table->Bg2ClipRectForDrawCmd.Min.y <= table->Bg2ClipRectForDrawCmd.Max.y);

        float row_height = table->RowPosY2 - table->RowPosY1;
        table->RowPosY2 = window->DC.CursorPos.y = table->WorkRect.Min.y + table->RowPosY2 - table->OuterRect.Min.y;
        table->RowPosY1 = table->RowPosY2 - row_height;
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            column->DrawChannelCurrent = column->DrawChannelUnfrozen;
            column->ClipRect.Min.y = table->Bg2ClipRectForDrawCmd.Min.y;
        }

        // Update cliprect ahead of TableBeginCell() so clipper can access to new ClipRect->Min.y
        SetWindowClipRectBeforeSetChannel(window, table->Columns[0].ClipRect);
        table->DrawSplitter.SetCurrentChannel(window->DrawList, table->Columns[0].DrawChannelCurrent);
    }

    if (!(table->RowFlags & ImGuiTableRowFlags_Headers))
        table->RowBgColorCounter++;
    table->IsInsideRow = false;
}